

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# model_flattening.cpp
# Opt level: O2

void __thiscall
ModelFlattening_flatteningModelsRequiringUnitsNameChangesInvolvingImportedComponents_Test::TestBody
          (ModelFlattening_flatteningModelsRequiringUnitsNameChangesInvolvingImportedComponents_Test
           *this)

{
  byte bVar1;
  char *pcVar2;
  void *local_90;
  AssertHelper local_88 [8];
  ModelPtr flatModel;
  AssertionResult gtest_ar_;
  ModelPtr model;
  ImporterPtr importer;
  ParserPtr parser;
  
  libcellml::Importer::create(SUB81(&importer,0));
  libcellml::Parser::create(SUB81(&parser,0));
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&gtest_ar_,"importer/HHComplete/MembraneModel.cellml",
             (allocator<char> *)&local_90);
  fileContents((string *)&flatModel);
  libcellml::Parser::parseModel((string *)&model);
  std::__cxx11::string::~string((string *)&flatModel);
  std::__cxx11::string::~string((string *)&gtest_ar_);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&gtest_ar_,"importer/HHComplete",(allocator<char> *)&local_90);
  resourcePath((string *)&flatModel);
  libcellml::Importer::resolveImports
            ((shared_ptr *)
             importer.super___shared_ptr<libcellml::Importer,_(__gnu_cxx::_Lock_policy)2>._M_ptr,
             (string *)&model);
  std::__cxx11::string::~string((string *)&flatModel);
  std::__cxx11::string::~string((string *)&gtest_ar_);
  bVar1 = libcellml::Model::hasUnresolvedImports();
  gtest_ar_.success_ = (bool)(bVar1 ^ 1);
  gtest_ar_.message_.ptr_ = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0
  ;
  if (bVar1 != 0) {
    testing::Message::Message((Message *)&local_90);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((AssertionResult *)&flatModel,&gtest_ar_.success_,"model->hasUnresolvedImports()",
               "true");
    testing::internal::AssertHelper::AssertHelper
              (local_88,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/cellml[P]libcellml/tests/importer/model_flattening.cpp"
               ,0x73a,(char *)flatModel.
                              super___shared_ptr<libcellml::Model,_(__gnu_cxx::_Lock_policy)2>.
                              _M_ptr);
    testing::internal::AssertHelper::operator=(local_88,(Message *)&local_90);
    testing::internal::AssertHelper::~AssertHelper(local_88);
    std::__cxx11::string::~string((string *)&flatModel);
    testing::internal::
    scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)&local_90);
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~scoped_ptr(&gtest_ar_.message_);
  libcellml::Importer::flattenModel((shared_ptr *)&flatModel);
  local_90 = (void *)0x0;
  testing::internal::CmpHelperNE<decltype(nullptr),std::shared_ptr<libcellml::Model>>
            ((internal *)&gtest_ar_,"nullptr","flatModel",&local_90,&flatModel);
  if (gtest_ar_.success_ == false) {
    testing::Message::Message((Message *)&local_90);
    if (gtest_ar_.message_.ptr_ ==
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar2 = "";
    }
    else {
      pcVar2 = ((gtest_ar_.message_.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (local_88,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/cellml[P]libcellml/tests/importer/model_flattening.cpp"
               ,0x73d,pcVar2);
    testing::internal::AssertHelper::operator=(local_88,(Message *)&local_90);
    testing::internal::AssertHelper::~AssertHelper(local_88);
    testing::internal::
    scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)&local_90);
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~scoped_ptr(&gtest_ar_.message_);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&flatModel.super___shared_ptr<libcellml::Model,_(__gnu_cxx::_Lock_policy)2>._M_refcount
            );
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&model.super___shared_ptr<libcellml::Model,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&parser.super___shared_ptr<libcellml::Parser,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&importer.super___shared_ptr<libcellml::Importer,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount);
  return;
}

Assistant:

TEST(ModelFlattening, flatteningModelsRequiringUnitsNameChangesInvolvingImportedComponents)
{
    auto importer = libcellml::Importer::create();
    auto parser = libcellml::Parser::create();

    auto model = parser->parseModel(fileContents("importer/HHComplete/MembraneModel.cellml"));
    importer->resolveImports(model, resourcePath("importer/HHComplete"));

    EXPECT_FALSE(model->hasUnresolvedImports());

    auto flatModel = importer->flattenModel(model);
    EXPECT_NE(nullptr, flatModel);
}